

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,false,false>
               (long *ldata,interval_t *rdata,interval_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong right;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  interval_t iVar10;
  interval_t left;
  interval_t left_00;
  ulong local_60;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = 0;
      iVar2 = count;
      do {
        iVar10.micros = *(int64_t *)((long)ldata + lVar5);
        iVar10._0_8_ = *(undefined8 *)((long)&rdata->micros + lVar5 * 2);
        iVar10 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                           (*(MultiplyOperator **)((long)&rdata->months + lVar5 * 2),iVar10,count);
        *(long *)((long)&result_data->months + lVar5 * 2) = iVar10._0_8_;
        *(int64_t *)((long)&result_data->micros + lVar5 * 2) = iVar10.micros;
        lVar5 = lVar5 + 8;
        iVar2 = iVar2 - 1;
      } while (iVar2 != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = 0;
    iVar2 = count;
    uVar6 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar3 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar3 = count;
        }
LAB_01489fa4:
        uVar4 = uVar6;
        if (uVar6 < uVar3) {
          uVar8 = uVar6 << 4 | 8;
          do {
            left.micros = ldata[uVar6];
            left._0_8_ = *(undefined8 *)((long)&rdata->months + uVar8);
            iVar10 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                               (*(MultiplyOperator **)((long)rdata + (uVar8 - 8)),left,iVar2);
            *(long *)((long)result_data + (uVar8 - 8)) = iVar10._0_8_;
            *(int64_t *)((long)&result_data->months + uVar8) = iVar10.micros;
            uVar6 = uVar6 + 1;
            uVar8 = uVar8 + 0x10;
            uVar4 = uVar3;
          } while (uVar3 != uVar6);
        }
      }
      else {
        uVar8 = puVar1[local_60];
        uVar3 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar3 = count;
        }
        uVar4 = uVar3;
        if (uVar8 != 0) {
          iVar2 = local_60;
          if (uVar8 == 0xffffffffffffffff) goto LAB_01489fa4;
          uVar4 = uVar6;
          if (uVar6 < uVar3) {
            uVar7 = uVar6 << 4 | 8;
            uVar9 = 0;
            right = local_60;
            do {
              if ((uVar8 >> (uVar9 & 0x3f) & 1) != 0) {
                left_00.micros = ldata[uVar6 + uVar9];
                left_00._0_8_ = *(undefined8 *)((long)&rdata->months + uVar7);
                iVar10 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                   (*(MultiplyOperator **)((long)rdata + (uVar7 - 8)),left_00,right)
                ;
                *(long *)((long)result_data + (uVar7 - 8)) = iVar10._0_8_;
                *(int64_t *)((long)&result_data->months + uVar7) = iVar10.micros;
              }
              uVar9 = uVar9 + 1;
              uVar7 = uVar7 + 0x10;
              uVar4 = uVar3;
            } while (uVar3 - uVar6 != uVar9);
          }
        }
      }
      iVar2 = local_60 + 1;
      uVar6 = uVar4;
      local_60 = iVar2;
    } while (iVar2 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}